

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O1

void __thiscall CEExecOptions::AddCirsPars(CEExecOptions *this)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"r,ra",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"RA in the CIRS coordinate frame (degrees)",&local_52);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_30,&local_50,0.0);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_52);
  std::__cxx11::string::~string((string *)&local_30);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"d,dec",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"DEC in the CIRS coordinate frame (degrees)",&local_52);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_30,&local_50,0.0);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_52);
  std::__cxx11::string::~string((string *)&local_30);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  return;
}

Assistant:

inline
void CEExecOptions::AddCirsPars(void)
{
    AddDoubleParam("r,ra", "RA in the CIRS coordinate frame (degrees)", 0.0);
    AddDoubleParam("d,dec", "DEC in the CIRS coordinate frame (degrees)", 0.0);
}